

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f __thiscall Quat4f::slerp(Quat4f *this,Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float x;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qa;
  undefined4 uVar9;
  Quat4f QVar10;
  float sinAngle;
  float angle;
  float c2;
  float c1;
  float cosAngle;
  bool allowFlip_local;
  float t_local;
  Quat4f *b_local;
  Quat4f *a_local;
  
  fVar5 = dot(a,b);
  if (0.01 <= 1.0 - ABS(fVar5)) {
    dVar7 = acos(ABS((double)fVar5));
    fVar6 = (float)dVar7;
    dVar7 = sin((double)fVar6);
    dVar8 = sin((double)(fVar6 * (1.0 - t)));
    angle = (float)(dVar8 / (double)(float)dVar7);
    dVar8 = sin((double)(fVar6 * t));
    sinAngle = (float)(dVar8 / (double)(float)dVar7);
  }
  else {
    angle = 1.0 - t;
    sinAngle = t;
  }
  if ((allowFlip) && (fVar5 < 0.0)) {
    angle = -angle;
  }
  pfVar4 = operator[](a,0);
  fVar5 = *pfVar4;
  pfVar4 = operator[](b,0);
  fVar6 = *pfVar4;
  pfVar4 = operator[](a,1);
  fVar1 = *pfVar4;
  pfVar4 = operator[](b,1);
  x = angle * fVar1 + sinAngle * *pfVar4;
  pfVar4 = operator[](a,2);
  fVar1 = *pfVar4;
  pfVar4 = operator[](b,2);
  fVar2 = *pfVar4;
  pfVar4 = operator[](a,3);
  fVar3 = *pfVar4;
  pfVar4 = operator[](b,3);
  uVar9 = 0;
  Quat4f(this,angle * fVar5 + sinAngle * fVar6,x,angle * fVar1 + sinAngle * fVar2,
         angle * fVar3 + sinAngle * *pfVar4);
  QVar10.m_elements[3] = (float)uVar9;
  QVar10.m_elements[2] = x;
  QVar10.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar10.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar10.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}